

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

shared_ptr<cpp_client::Base_object> __thiscall
cpp_client::Any::holder2<std::shared_ptr<cpp_client::Base_object>_>::get_ptr
          (holder2<std::shared_ptr<cpp_client::Base_object>_> *this)

{
  shared_ptr<cpp_client::Base_object> sVar1;
  undefined1 local_19 [9];
  holder2<std::shared_ptr<cpp_client::Base_object>_> *this_local;
  
  this_local = this;
  sVar1 = overload_things<std::shared_ptr<cpp_client::Base_object>,_void>::get_ptr
                    ((overload_things<std::shared_ptr<cpp_client::Base_object>,_void> *)this,
                     (shared_ptr<cpp_client::Base_object> *)local_19);
  sVar1.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cpp_client::Base_object>)
         sVar1.super___shared_ptr<cpp_client::Base_object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<Base_object> get_ptr() override
      {
         return overload_things<T>{}.get_ptr(obj_);
      }